

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void array_suite::fail_missing_value(void)

{
  bool bVar1;
  error_code eVar2;
  char input [4];
  reader reader;
  uint local_174;
  view_type local_170;
  char local_15c [4];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_15c,"[,]",4);
  local_170._M_len = strlen(local_15c);
  local_170._M_str = local_15c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c9,"void array_suite::fail_missing_value()",&local_170,&local_174);
  local_170._M_len = trial::protocol::json::basic_reader<char>::level(&local_158);
  local_174 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ca,"void array_suite::fail_missing_value()",&local_170,&local_174);
  local_170._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_170._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1cb,"void array_suite::fail_missing_value()",&local_170,"[");
  local_170._M_len = (long)local_158.decoder.input.tail - (long)local_158.decoder.input.head;
  local_170._M_str = local_158.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[3]>
            ("reader.tail()","\",]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1cc,"void array_suite::fail_missing_value()",&local_170,",]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
  local_174 = local_174 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ce,"void array_suite::fail_missing_value()",&local_170,&local_174);
  eVar2 = trial::protocol::json::detail::basic_decoder<char>::error(&local_158.decoder);
  local_170._M_str = (char *)eVar2._M_cat;
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,eVar2._M_value);
  local_174 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1cf,"void array_suite::fail_missing_value()",&local_170,&local_174);
  local_170._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_170._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\",\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1d0,"void array_suite::fail_missing_value()",&local_170,",");
  local_170._M_len = (long)local_158.decoder.input.tail - (long)local_158.decoder.input.head;
  local_170._M_str = local_158.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.tail()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1d1,"void array_suite::fail_missing_value()",&local_170,"]");
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void fail_missing_value()
{
    const char input[] = "[,]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), ",");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]");
}